

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

int __thiscall JetHead::File::close(File *this,int __fd)

{
  int iVar1;
  int iVar2;
  ErrCode EVar3;
  int *piVar4;
  
  if (this->mFd == -1) {
    iVar2 = 0xc;
  }
  else {
    iVar1 = ::close(this->mFd);
    this->mFd = -1;
    iVar2 = 0;
    if (iVar1 == -1) {
      piVar4 = __errno_location();
      EVar3 = getErrorCode(*piVar4);
      return EVar3;
    }
  }
  return iVar2;
}

Assistant:

JetHead::ErrCode File::close()
{
	TRACE_BEGIN(LOG_LVL_INFO);
	LOG_INFO( "fd %d", mFd );
	if ( mFd != -1 )
	{
		int res = ::close( mFd );
		mFd = -1;
		if ( res == -1 )
		{
			return getErrorCode( errno );
		}
	}
	else
		return JetHead::kNotInitialized;

	return JetHead::kNoError;
}